

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

mat33 * nifti_mat33_polar(mat33 A)

{
  mat33 A_00;
  mat33 R;
  mat33 A_01;
  mat33 A_02;
  mat33 A_03;
  mat33 A_04;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  mat33 *in_RDI;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  float in_stack_00000028;
  mat33 X;
  float local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float local_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float local_70;
  
  local_b8 = in_stack_00000008;
  uVar3 = local_b8;
  uStack_b0 = in_stack_00000010;
  uVar1 = uStack_b0;
  local_a8 = in_stack_00000018;
  uVar4 = local_a8;
  uStack_a0 = in_stack_00000020;
  uVar2 = uStack_a0;
  local_98 = in_stack_00000028;
  local_b8._0_4_ = (float)in_stack_00000008;
  local_b8._4_4_ = (float)((ulong)in_stack_00000008 >> 0x20);
  uStack_b0._0_4_ = (float)in_stack_00000010;
  uStack_b0._4_4_ = (float)((ulong)in_stack_00000010 >> 0x20);
  local_a8._0_4_ = (float)in_stack_00000018;
  local_a8._4_4_ = (float)((ulong)in_stack_00000018 >> 0x20);
  fVar10 = local_a8._4_4_;
  uStack_a0._0_4_ = (float)in_stack_00000020;
  uStack_a0._4_4_ = (float)((ulong)in_stack_00000020 >> 0x20);
  fVar7 = -uStack_b0._4_4_ * local_b8._4_4_;
  fVar9 = uStack_b0._4_4_ * uStack_a0._4_4_ * (float)uStack_b0;
  fVar8 = local_b8._4_4_ * (float)uStack_a0 * local_a8._4_4_;
  fVar11 = (in_stack_00000028 * fVar7 +
            ((float)local_b8 * (float)local_a8 * in_stack_00000028 -
            (float)local_b8 * uStack_a0._4_4_ * local_a8._4_4_) + fVar9 + fVar8) -
           (float)local_a8 * (float)uStack_a0 * (float)uStack_b0;
  if ((fVar11 == 0.0) && (!NAN(fVar11))) {
    fVar11 = (float)local_b8;
    fVar13 = (float)local_a8;
    local_b8 = uVar3;
    local_a8 = uVar4;
    do {
      A_00.m._8_8_ = in_stack_00000010;
      A_00.m[0][0] = (float)local_b8;
      A_00.m[0][1] = local_b8._4_4_;
      A_00.m[1][1] = (float)local_a8;
      A_00.m[1][2] = local_a8._4_4_;
      A_00.m[2]._0_8_ = in_stack_00000020;
      A_00.m[2][2] = local_98;
      fVar6 = nifti_mat33_rownorm(A_00);
      fVar6 = (fVar6 + 0.001) * 1e-05;
      fVar11 = fVar11 + fVar6;
      fVar13 = fVar13 + fVar6;
      local_98 = local_98 + fVar6;
      local_b8 = CONCAT44(local_b8._4_4_,fVar11);
      local_a8 = CONCAT44(local_a8._4_4_,fVar13);
      uVar3 = local_b8;
      uVar4 = local_a8;
    } while (fVar13 * -(float)uStack_a0 * (float)uStack_b0 +
             local_98 * fVar7 + (fVar11 * fVar13 * local_98 - uStack_a0._4_4_ * fVar11 * fVar10) +
             fVar9 + fVar8 == 0.0);
  }
  local_a8 = uVar4;
  local_b8 = uVar3;
  uVar5 = 0;
  local_c0 = 1.0;
  uStack_b0 = uVar1;
  uStack_a0 = uVar2;
  while( true ) {
    R.m[0][2] = (float)uStack_b0;
    R.m[1][0] = uStack_b0._4_4_;
    R.m[0][0] = (float)local_b8;
    R.m[0][1] = local_b8._4_4_;
    R.m[1][1] = (float)local_a8;
    R.m[1][2] = local_a8._4_4_;
    R.m[2][0] = (float)uStack_a0;
    R.m[2][1] = uStack_a0._4_4_;
    R.m[2][2] = local_98;
    nifti_mat33_inverse(R);
    fVar7 = 1.0;
    fVar11 = fVar7;
    if (0.3 < local_c0) {
      A_01.m[0][2] = (float)uStack_b0;
      A_01.m[1][0] = uStack_b0._4_4_;
      A_01.m[0][0] = (float)local_b8;
      A_01.m[0][1] = local_b8._4_4_;
      A_01.m[1][1] = (float)local_a8;
      A_01.m[1][2] = local_a8._4_4_;
      A_01.m[2][0] = (float)uStack_a0;
      A_01.m[2][1] = uStack_a0._4_4_;
      A_01.m[2][2] = local_98;
      fVar11 = nifti_mat33_rownorm(A_01);
      A_02.m[0][2] = (float)uStack_b0;
      A_02.m[1][0] = uStack_b0._4_4_;
      A_02.m[0][0] = (float)local_b8;
      A_02.m[0][1] = local_b8._4_4_;
      A_02.m[1][1] = (float)local_a8;
      A_02.m[1][2] = local_a8._4_4_;
      A_02.m[2][0] = (float)uStack_a0;
      A_02.m[2][1] = uStack_a0._4_4_;
      A_02.m[2][2] = local_98;
      fVar7 = nifti_mat33_colnorm(A_02);
      fVar7 = fVar7 * fVar11;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      A_03.m[0][1] = fStack_8c;
      A_03.m[0][0] = local_90;
      A_03.m[1][0] = fStack_84;
      A_03.m[0][2] = fStack_88;
      A_03.m[1][2] = fStack_7c;
      A_03.m[1][1] = local_80;
      A_03.m[2][1] = fStack_74;
      A_03.m[2][0] = fStack_78;
      A_03.m[2][2] = local_70;
      fVar8 = nifti_mat33_rownorm(A_03);
      A_04.m[0][1] = fStack_8c;
      A_04.m[0][0] = local_90;
      A_04.m[1][0] = fStack_84;
      A_04.m[0][2] = fStack_88;
      A_04.m[1][2] = fStack_7c;
      A_04.m[1][1] = local_80;
      A_04.m[2][1] = fStack_74;
      A_04.m[2][0] = fStack_78;
      A_04.m[2][2] = local_70;
      fVar11 = nifti_mat33_colnorm(A_04);
      fVar11 = fVar11 * fVar8;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      fVar11 = fVar11 / fVar7;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      fVar7 = 1.0 / fVar11;
    }
    fVar9 = (fVar11 * (float)local_b8 + local_90 * fVar7) * 0.5;
    in_RDI->m[0][0] = fVar9;
    fVar10 = (fVar11 * local_b8._4_4_ + fStack_84 * fVar7) * 0.5;
    in_RDI->m[0][1] = fVar10;
    fVar13 = (fVar11 * (float)uStack_b0 + fStack_78 * fVar7) * 0.5;
    in_RDI->m[0][2] = fVar13;
    fVar6 = (fVar11 * uStack_b0._4_4_ + fStack_8c * fVar7) * 0.5;
    in_RDI->m[1][0] = fVar6;
    fVar12 = (fVar11 * (float)local_a8 + local_80 * fVar7) * 0.5;
    in_RDI->m[1][1] = fVar12;
    fVar14 = (fVar11 * local_a8._4_4_ + fStack_74 * fVar7) * 0.5;
    in_RDI->m[1][2] = fVar14;
    fVar15 = (fVar11 * (float)uStack_a0 + fStack_88 * fVar7) * 0.5;
    in_RDI->m[2][0] = fVar15;
    fVar8 = (fVar11 * uStack_a0._4_4_ + fStack_7c * fVar7) * 0.5;
    in_RDI->m[2][1] = fVar8;
    fVar11 = (fVar11 * local_98 + fVar7 * local_70) * 0.5;
    in_RDI->m[2][2] = fVar11;
    if ((99 < uVar5) ||
       (local_c0 = ABS(fVar11 - local_98) +
                   ABS(fVar8 - uStack_a0._4_4_) +
                   ABS(fVar15 - (float)uStack_a0) +
                   ABS(fVar14 - local_a8._4_4_) +
                   ABS(fVar12 - (float)local_a8) +
                   ABS(fVar6 - uStack_b0._4_4_) +
                   ABS(fVar13 - (float)uStack_b0) +
                   ABS(fVar10 - local_b8._4_4_) + ABS(fVar9 - (float)local_b8), local_c0 < 3e-06))
    break;
    uVar5 = uVar5 + 1;
    local_98 = in_RDI->m[2][2];
    local_b8 = *(undefined8 *)in_RDI->m[0];
    uStack_b0 = *(undefined8 *)(in_RDI->m[0] + 2);
    local_a8 = *(undefined8 *)(in_RDI->m[1] + 1);
    uStack_a0 = *(undefined8 *)in_RDI->m[2];
  }
  return in_RDI;
}

Assistant:

mat33 nifti_mat33_polar( mat33 A )
{
   mat33 X , Y , Z ;
   float alp,bet,gam,gmi , dif=1.0f ;
   int k=0 ;

   X = A ;

   /* force matrix to be nonsingular */

   gam = nifti_mat33_determ(X) ;
   while( gam == 0.0 ){        /* perturb matrix */
     gam = (float)( 0.00001 * ( 0.001 + nifti_mat33_rownorm(X) ) ) ;
     X.m[0][0] += gam ; X.m[1][1] += gam ; X.m[2][2] += gam ;
     gam = nifti_mat33_determ(X) ;
   }

   while(1){
     Y = nifti_mat33_inverse(X) ;
     if( dif > 0.3 ){     /* far from convergence */
       alp = (float)( sqrt( nifti_mat33_rownorm(X) * nifti_mat33_colnorm(X) ) ) ;
       bet = (float)( sqrt( nifti_mat33_rownorm(Y) * nifti_mat33_colnorm(Y) ) ) ;
       gam = (float)( sqrt( bet / alp ) ) ;
       gmi = (float)( 1.0 / gam ) ;
     } else {
       gam = gmi = 1.0f ;  /* close to convergence */
     }
     Z.m[0][0] = (float)( 0.5 * ( gam*X.m[0][0] + gmi*Y.m[0][0] ) ) ;
     Z.m[0][1] = (float)( 0.5 * ( gam*X.m[0][1] + gmi*Y.m[1][0] ) ) ;
     Z.m[0][2] = (float)( 0.5 * ( gam*X.m[0][2] + gmi*Y.m[2][0] ) ) ;
     Z.m[1][0] = (float)( 0.5 * ( gam*X.m[1][0] + gmi*Y.m[0][1] ) ) ;
     Z.m[1][1] = (float)( 0.5 * ( gam*X.m[1][1] + gmi*Y.m[1][1] ) ) ;
     Z.m[1][2] = (float)( 0.5 * ( gam*X.m[1][2] + gmi*Y.m[2][1] ) ) ;
     Z.m[2][0] = (float)( 0.5 * ( gam*X.m[2][0] + gmi*Y.m[0][2] ) ) ;
     Z.m[2][1] = (float)( 0.5 * ( gam*X.m[2][1] + gmi*Y.m[1][2] ) ) ;
     Z.m[2][2] = (float)( 0.5 * ( gam*X.m[2][2] + gmi*Y.m[2][2] ) ) ;

     dif = (float)( fabs(Z.m[0][0]-X.m[0][0])+fabs(Z.m[0][1]-X.m[0][1])
          +fabs(Z.m[0][2]-X.m[0][2])+fabs(Z.m[1][0]-X.m[1][0])
          +fabs(Z.m[1][1]-X.m[1][1])+fabs(Z.m[1][2]-X.m[1][2])
          +fabs(Z.m[2][0]-X.m[2][0])+fabs(Z.m[2][1]-X.m[2][1])
          +fabs(Z.m[2][2]-X.m[2][2])                          );

     k = k+1 ;
     if( k > 100 || dif < 3.e-6 ) break ;  /* convergence or exhaustion */
     X = Z ;
   }

   return Z ;
}